

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableSortSpecsBuild(ImGuiTable *table)

{
  byte bVar1;
  ImGuiTableColumn *pIVar2;
  ImGuiID *pIVar3;
  long in_RDI;
  ImGuiTable *unaff_retaddr;
  ImGuiTableColumnSortSpecs *sort_spec;
  ImGuiTableColumn *column;
  int column_n;
  ImGuiTableColumnSortSpecs *sort_specs;
  bool dirty;
  int in_stack_ffffffffffffffac;
  ImVector<ImGuiTableColumnSortSpecs> *in_stack_ffffffffffffffb0;
  long local_48;
  int local_1c;
  
  bVar1 = *(byte *)(in_RDI + 0x1fc) & 1;
  if (bVar1 != 0) {
    TableSortSpecsSanitize(unaff_retaddr);
    ImVector<ImGuiTableColumnSortSpecs>::resize(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac)
    ;
    *(undefined1 *)(in_RDI + 0x1dc) = 1;
    *(undefined1 *)(in_RDI + 0x1fc) = 0;
  }
  if (*(char *)(in_RDI + 0x1e0) == '\0') {
    local_48 = 0;
  }
  else if (*(char *)(in_RDI + 0x1e0) == '\x01') {
    local_48 = in_RDI + 0x1b0;
  }
  else {
    local_48 = *(long *)(in_RDI + 0x1c8);
  }
  if ((bVar1 != 0) && (local_48 != 0)) {
    for (local_1c = 0; local_1c < *(int *)(in_RDI + 0x74); local_1c = local_1c + 1) {
      pIVar2 = ImSpan<ImGuiTableColumn>::operator[]
                         ((ImSpan<ImGuiTableColumn> *)(in_RDI + 0x18),local_1c);
      if (pIVar2->SortOrder != -1) {
        pIVar3 = (ImGuiID *)(local_48 + (long)pIVar2->SortOrder * 0xc);
        *pIVar3 = pIVar2->UserID;
        *(short *)(pIVar3 + 1) = (short)(char)local_1c;
        *(short *)((long)pIVar3 + 6) = (short)pIVar2->SortOrder;
        *(byte *)(pIVar3 + 2) = pIVar2->field_0x65 & 3;
      }
    }
  }
  *(long *)(in_RDI + 0x1d0) = local_48;
  *(int *)(in_RDI + 0x1d8) = (int)*(char *)(in_RDI + 0x1e0);
  return;
}

Assistant:

void ImGui::TableSortSpecsBuild(ImGuiTable* table)
{
    bool dirty = table->IsSortSpecsDirty;
    if (dirty)
    {
        TableSortSpecsSanitize(table);
        table->SortSpecsMulti.resize(table->SortSpecsCount <= 1 ? 0 : table->SortSpecsCount);
        table->SortSpecs.SpecsDirty = true; // Mark as dirty for user
        table->IsSortSpecsDirty = false; // Mark as not dirty for us
    }

    // Write output
    ImGuiTableColumnSortSpecs* sort_specs = (table->SortSpecsCount == 0) ? NULL : (table->SortSpecsCount == 1) ? &table->SortSpecsSingle : table->SortSpecsMulti.Data;
    if (dirty && sort_specs != NULL)
        for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
        {
            ImGuiTableColumn* column = &table->Columns[column_n];
            if (column->SortOrder == -1)
                continue;
            IM_ASSERT(column->SortOrder < table->SortSpecsCount);
            ImGuiTableColumnSortSpecs* sort_spec = &sort_specs[column->SortOrder];
            sort_spec->ColumnUserID = column->UserID;
            sort_spec->ColumnIndex = (ImGuiTableColumnIdx)column_n;
            sort_spec->SortOrder = (ImGuiTableColumnIdx)column->SortOrder;
            sort_spec->SortDirection = column->SortDirection;
        }

    table->SortSpecs.Specs = sort_specs;
    table->SortSpecs.SpecsCount = table->SortSpecsCount;
}